

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

void __thiscall
sentencepiece::ModelProto_SentencePiece::InternalSwap
          (ModelProto_SentencePiece *this,ModelProto_SentencePiece *other)

{
  float fVar1;
  uint32 uVar2;
  int iVar3;
  void *pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other_00;
  
  google::protobuf::internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  pvVar4 = (other->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)(this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    if (((ulong)pvVar4 & 1) == 0) goto LAB_00222113;
LAB_00222102:
    other_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((ulong)pvVar4 & 0xfffffffffffffffe) + 8);
  }
  else {
    if (((ulong)pvVar4 & 1) != 0) goto LAB_00222102;
    other_00 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<std::__cxx11::string>
                         (&(other->super_MessageLite)._internal_metadata_);
  }
  google::protobuf::internal::InternalMetadata::DoSwap<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,other_00);
LAB_00222113:
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  pvVar4 = (this->piece_).tagged_ptr_.ptr_;
  (this->piece_).tagged_ptr_.ptr_ = (other->piece_).tagged_ptr_.ptr_;
  (other->piece_).tagged_ptr_.ptr_ = pvVar4;
  fVar1 = this->score_;
  this->score_ = other->score_;
  other->score_ = fVar1;
  iVar3 = this->type_;
  this->type_ = other->type_;
  other->type_ = iVar3;
  return;
}

Assistant:

void ModelProto_SentencePiece::InternalSwap(ModelProto_SentencePiece* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap<std::string>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  piece_.Swap(&other->piece_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swap(score_, other->score_);
  swap(type_, other->type_);
}